

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O3

bool __thiscall QtPrivate::equalStrings(QtPrivate *this,QStringView lhs,QLatin1StringView rhs)

{
  byte bVar1;
  QtPrivate *pQVar2;
  byte *pbVar3;
  QtPrivate *pQVar4;
  
  pbVar3 = (byte *)lhs.m_size;
  pQVar2 = this;
  do {
    pQVar4 = pQVar2;
    if (this + (long)lhs.m_data * 2 <= pQVar4) break;
    bVar1 = *pbVar3;
    pbVar3 = pbVar3 + 1;
    pQVar2 = pQVar4 + 2;
  } while (*(ushort *)pQVar4 == (ushort)bVar1);
  return this + (long)lhs.m_data * 2 <= pQVar4;
}

Assistant:

static int ucstrncmp(const char16_t *a, const char *b, size_t l)
{
    const uchar *c = reinterpret_cast<const uchar *>(b);
    const char16_t *uc = a;
    const char16_t *e = uc + l;

#if defined(__SSE2__) && !defined(__OPTIMIZE_SIZE__)
    return ucstrncmp_sse2<Mode>(uc, c, l);
#endif

    while (uc < e) {
        int diff = *uc - *c;
        if (diff)
            return diff;
        uc++, c++;
    }

    return 0;
}